

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O0

bool __thiscall QAM::operator<(QAM *this,QAM *rhs)

{
  bool bVar1;
  array<int,_4UL> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__one;
  undefined1 local_1;
  
  __one = in_RDI;
  bVar1 = std::operator<((array<int,_4UL> *)in_RDI,in_RSI);
  if (bVar1) {
    local_1 = true;
  }
  else {
    bVar1 = std::operator==((array<int,_4UL> *)__one,in_RSI);
    if (bVar1) {
      local_1 = std::operator<(in_RDI,in_stack_ffffffffffffffd8);
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool operator<(const QAM & rhs) const
    {
        if(qam < rhs.qam)
            return true;
        else if(qam == rhs.qam)
            return tag < rhs.tag;
        else
            return false;
    }